

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

void __thiscall wasm::PassRunner::runOnFunction(PassRunner *this,Function *func)

{
  bool bVar1;
  ostream *this_00;
  ostream *poVar2;
  reference this_01;
  pointer pass_00;
  Name name;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *pass;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  *__range1;
  Function *func_local;
  PassRunner *this_local;
  
  if (((this->options).debug & 1U) != 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"[PassRunner] running passes on function ");
    poVar2 = (ostream *)(func->super_Importable).super_Named.name.super_IString.str._M_len;
    name.super_IString.str._M_str = (char *)poVar2;
    name.super_IString.str._M_len =
         (size_t)(func->super_Importable).super_Named.name.super_IString.str._M_str;
    poVar2 = wasm::operator<<((wasm *)this_00,poVar2,name);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  __end1 = std::
           vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
           ::begin(&this->passes);
  pass = (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)
         std::
         vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
         ::end(&this->passes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_*,_std::vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>_>
                                *)&pass);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_*,_std::vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>_>
              ::operator*(&__end1);
    pass_00 = std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::get(this_01);
    runPassOnFunction(this,pass_00,func);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_*,_std::vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void PassRunner::runOnFunction(Function* func) {
  if (options.debug) {
    std::cerr << "[PassRunner] running passes on function " << func->name
              << std::endl;
  }
  for (auto& pass : passes) {
    runPassOnFunction(pass.get(), func);
  }
}